

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)8>(Thread *this)

{
  difference_type dVar1;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  unsigned_short local_18 [8];
  
  local_18 = (unsigned_short  [8])Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  dVar1 = std::
          __count_if<unsigned_short*,__gnu_cxx::__ops::_Iter_pred<wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)8>()::_lambda(unsigned_short)_1_>>
                    (local_18);
  Push<bool>(this,7 < dVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}